

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

ImVec2 ImGui::CalcTextSize(char *text,char *text_end,bool hide_text_after_double_hash,
                          float wrap_width)

{
  undefined8 uVar1;
  ImGuiContext *pIVar2;
  byte in_DL;
  char *in_RSI;
  char *in_RDI;
  undefined1 auVar3 [64];
  char **unaff_retaddr;
  char *in_stack_00000008;
  float font_size;
  ImFont *font;
  char *text_display_end;
  ImGuiContext *g;
  undefined3 in_stack_0000002c;
  ImVec2 text_size;
  char *local_30;
  ImVec2 local_8;
  undefined1 extraout_var [56];
  
  pIVar2 = GImGui;
  local_30 = in_RSI;
  if ((in_DL & 1) != 0) {
    local_30 = FindRenderedTextEnd(in_RDI,in_RSI);
  }
  if (in_RDI == local_30) {
    ImVec2::ImVec2(&local_8,0.0,pIVar2->FontSize);
  }
  else {
    auVar3._0_8_ = ImFont::CalcTextSizeA
                             ((ImFont *)CONCAT44(_in_stack_0000002c,wrap_width),g._4_4_,g._0_4_,
                              text_display_end._4_4_,(char *)font,in_stack_00000008,unaff_retaddr);
    auVar3._8_56_ = extraout_var;
    uVar1 = vmovlpd_avx(auVar3._0_16_);
    local_8.x = (float)uVar1;
    local_8.y = (float)((ulong)uVar1 >> 0x20);
    local_8.x = (float)(int)(local_8.x + 0.99999);
  }
  return local_8;
}

Assistant:

ImVec2 ImGui::CalcTextSize(const char* text, const char* text_end, bool hide_text_after_double_hash, float wrap_width)
{
    ImGuiContext& g = *GImGui;

    const char* text_display_end;
    if (hide_text_after_double_hash)
        text_display_end = FindRenderedTextEnd(text, text_end);      // Hide anything after a '##' string
    else
        text_display_end = text_end;

    ImFont* font = g.Font;
    const float font_size = g.FontSize;
    if (text == text_display_end)
        return ImVec2(0.0f, font_size);
    ImVec2 text_size = font->CalcTextSizeA(font_size, FLT_MAX, wrap_width, text, text_display_end, NULL);

    // Round
    // FIXME: This has been here since Dec 2015 (7b0bf230) but down the line we want this out.
    // FIXME: Investigate using ceilf or e.g.
    // - https://git.musl-libc.org/cgit/musl/tree/src/math/ceilf.c
    // - https://embarkstudios.github.io/rust-gpu/api/src/libm/math/ceilf.rs.html
    text_size.x = IM_FLOOR(text_size.x + 0.99999f);

    return text_size;
}